

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaGetProp(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,char *name)

{
  xmlChar *name_00;
  xmlChar *ret;
  xmlChar *val;
  char *name_local;
  xmlNodePtr node_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  name_00 = xmlGetNoNsProp(node,(xmlChar *)name);
  if (name_00 == (xmlChar *)0x0) {
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    ctxt_local = (xmlSchemaParserCtxtPtr)xmlDictLookup(ctxt->dict,name_00,-1);
    (*xmlFree)(name_00);
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static const xmlChar *
xmlSchemaGetProp(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node,
                 const char *name)
{
    xmlChar *val;
    const xmlChar *ret;

    val = xmlGetNoNsProp(node, BAD_CAST name);
    if (val == NULL)
        return(NULL);
    ret = xmlDictLookup(ctxt->dict, val, -1);
    xmlFree(val);
    return(ret);
}